

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandedDecl::applyParams
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandedDecl *this,
          Array<capnp::compiler::BrandedDecl> *params,Reader subSource)

{
  BrandScope *pBVar1;
  NullableValue<capnp::compiler::BrandedDecl> *pNVar2;
  BrandedDecl *pBVar3;
  Disposer *pDVar4;
  undefined1 local_f8 [8];
  BrandScope *local_f0;
  BrandedDecl *local_e8;
  Disposer *pDStack_e0;
  BrandScope *local_d8;
  BrandedDecl local_c8;
  
  if ((this->body).tag == 2) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    pBVar1 = (this->brand).ptr;
    local_e8 = params->ptr;
    pDStack_e0 = (Disposer *)params->size_;
    local_d8 = (BrandScope *)params->disposer;
    params->ptr = (BrandedDecl *)0x0;
    params->size_ = 0;
    BrandScope::setParams
              ((BrandScope *)local_f8,(Array<capnp::compiler::BrandedDecl> *)pBVar1,(Which)&local_e8
               ,subSource);
    if (local_f0 == (BrandScope *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      BrandedDecl(&local_c8,this);
      pBVar1 = local_c8.brand.ptr;
      pDVar4 = local_c8.brand.disposer;
      local_c8.brand.disposer = (Disposer *)local_f8;
      local_c8.brand.ptr = local_f0;
      local_f0 = (BrandScope *)0x0;
      if (pBVar1 != (BrandScope *)0x0) {
        (**pDVar4->_vptr_Disposer)
                  (pDVar4,(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                          (long)&(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer);
      }
      local_c8.source._reader.dataSize = subSource._reader.dataSize;
      local_c8.source._reader.pointerCount = subSource._reader.pointerCount;
      local_c8.source._reader._38_2_ = subSource._reader._38_2_;
      local_c8.source._reader.nestingLimit = subSource._reader.nestingLimit;
      local_c8.source._reader._44_4_ = subSource._reader._44_4_;
      local_c8.source._reader.data = subSource._reader.data;
      local_c8.source._reader.pointers = subSource._reader.pointers;
      local_c8.source._reader.segment = subSource._reader.segment;
      local_c8.source._reader.capTable = subSource._reader.capTable;
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = local_c8.body.tag;
      if (local_c8.body.tag == 2) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             local_c8.body.field_1._0_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_c8.body.field_1._8_8_;
      }
      else if (local_c8.body.tag == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
             local_c8.body.field_1._32_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             local_c8.body.field_1._16_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             local_c8.body.field_1._24_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             local_c8.body.field_1._0_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_c8.body.field_1._8_8_;
        *(byte *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) =
             local_c8.body.field_1.space[0x28];
        if (local_c8.body.field_1.space[0x28] == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
               local_c8.body.field_1._80_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
               local_c8.body.field_1._88_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
               local_c8.body.field_1._64_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
               local_c8.body.field_1._72_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
               local_c8.body.field_1._48_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
               local_c8.body.field_1._56_8_;
          local_c8.body.field_1.space[0x28] = '\0';
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = local_c8.brand.disposer;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = local_c8.brand.ptr;
      local_c8.brand.ptr = (BrandScope *)0x0;
      pNVar2 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar2->field_1 + 0x98) = subSource._reader.dataSize;
      *(StructPointerCount *)((long)&pNVar2->field_1 + 0x9c) = subSource._reader.pointerCount;
      *(undefined2 *)((long)&pNVar2->field_1 + 0x9e) = subSource._reader._38_2_;
      *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = subSource._reader.nestingLimit
      ;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) =
           subSource._reader._44_4_;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data = subSource._reader.data;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
           subSource._reader.pointers;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = subSource._reader.segment
      ;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
           subSource._reader.capTable;
      if (local_c8.body.tag == 1) {
        local_c8.body.tag = 0;
      }
      if (local_c8.body.tag == 2) {
        local_c8.body.tag = 0;
      }
    }
    pBVar1 = local_f0;
    if (local_f0 != (BrandScope *)0x0) {
      local_f0 = (BrandScope *)0x0;
      (***(_func_int ***)local_f8)
                (local_f8,(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                          (long)&(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer);
    }
    pDVar4 = pDStack_e0;
    pBVar3 = local_e8;
    if (local_e8 != (BrandedDecl *)0x0) {
      local_e8 = (BrandedDecl *)0x0;
      pDStack_e0 = (Disposer *)0x0;
      (**(local_d8->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_d8,pBVar3,0xa8,pDVar4,pDVar4,
                 kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandedDecl::applyParams(
    kj::Array<BrandedDecl> params, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return kj::none;
  } else {
    return brand->setParams(kj::mv(params), body.get<Resolver::ResolvedDecl>().kind, subSource)
        .map([&](kj::Own<BrandScope>&& scope) {
      BrandedDecl result = *this;
      result.brand = kj::mv(scope);
      result.source = subSource;
      return result;
    });
  }
}